

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

bool __thiscall FNodeBuilder::GetPolyExtents(FNodeBuilder *this,int polynum,fixed_t *bbox)

{
  int iVar1;
  line_t_conflict *plVar2;
  uint uVar3;
  fixed_t fVar4;
  uint uVar5;
  FPrivSeg *pFVar6;
  FPrivVert *pFVar7;
  bool bVar8;
  uint local_48;
  bool found;
  uint count;
  uint vert;
  vertex_t start;
  uint i;
  fixed_t *bbox_local;
  int polynum_local;
  FNodeBuilder *this_local;
  
  bbox[1] = 0x7fffffff;
  bbox[2] = 0x7fffffff;
  *bbox = -0x80000000;
  bbox[3] = -0x80000000;
  start.p.Y._4_4_ = 0;
  while ((uVar5 = start.p.Y._4_4_,
         uVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs),
         uVar5 < uVar3 &&
         ((plVar2 = this->Level->Lines,
          pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                             (&this->Segs,(ulong)start.p.Y._4_4_),
          plVar2[pFVar6->linedef].special != 1 ||
          (plVar2 = this->Level->Lines,
          pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                             (&this->Segs,(ulong)start.p.Y._4_4_),
          plVar2[pFVar6->linedef].args[0] != polynum))))) {
    start.p.Y._4_4_ = start.p.Y._4_4_ + 1;
  }
  uVar5 = start.p.Y._4_4_;
  uVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
  if (uVar5 < uVar3) {
    vertex_t::vertex_t((vertex_t *)&count);
    local_48 = 0;
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)start.p.Y._4_4_);
    uVar5 = pFVar6->v1;
    pFVar7 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(ulong)uVar5);
    fVar4 = (pFVar7->super_FSimpleVert).x;
    pFVar7 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(ulong)uVar5);
    vertex_t::set((vertex_t *)&count,fVar4,(pFVar7->super_FSimpleVert).y);
    do {
      pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)start.p.Y._4_4_);
      AddSegToBBox(this,bbox,pFVar6);
      pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)start.p.Y._4_4_);
      uVar5 = pFVar6->v2;
      pFVar7 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(ulong)uVar5);
      start.p.Y._4_4_ = pFVar7->segs;
      local_48 = local_48 + 1;
      bVar8 = false;
      if (start.p.Y._4_4_ != 0xffffffff) {
        pFVar7 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                           (&this->Vertices,(ulong)uVar5);
        iVar1 = (pFVar7->super_FSimpleVert).x;
        fVar4 = vertex_t::fixX((vertex_t *)&count);
        if (iVar1 == fVar4) {
          pFVar7 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                             (&this->Vertices,(ulong)uVar5);
          iVar1 = (pFVar7->super_FSimpleVert).y;
          fVar4 = vertex_t::fixY((vertex_t *)&count);
          bVar8 = false;
          if (iVar1 == fVar4) goto LAB_004d5a81;
        }
        uVar5 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
        bVar8 = local_48 < uVar5;
      }
LAB_004d5a81:
    } while (bVar8);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
    for (start.p.Y._4_4_ = 0; uVar5 = start.p.Y._4_4_,
        uVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs),
        uVar5 < uVar3; start.p.Y._4_4_ = start.p.Y._4_4_ + 1) {
      plVar2 = this->Level->Lines;
      pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)start.p.Y._4_4_);
      if ((plVar2[pFVar6->linedef].special == 5) &&
         (plVar2 = this->Level->Lines,
         pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                            (&this->Segs,(ulong)start.p.Y._4_4_),
         plVar2[pFVar6->linedef].args[0] == polynum)) {
        pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                           (&this->Segs,(ulong)start.p.Y._4_4_);
        AddSegToBBox(this,bbox,pFVar6);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FNodeBuilder::GetPolyExtents (int polynum, fixed_t bbox[4])
{
	unsigned int i;

	bbox[BOXLEFT] = bbox[BOXBOTTOM] = FIXED_MAX;
	bbox[BOXRIGHT] = bbox[BOXTOP] = FIXED_MIN;

	// Try to find a polyobj marked with a start line
	for (i = 0; i < Segs.Size(); ++i)
	{
		if (Level.Lines[Segs[i].linedef].special == PO_LINE_START &&
			Level.Lines[Segs[i].linedef].args[0] == polynum)
		{
			break;
		}
	}

	if (i < Segs.Size())
	{
		vertex_t start;
		unsigned int vert;
		unsigned int count = 0;

		vert = Segs[i].v1;

		start.set(Vertices[vert].x, Vertices[vert].y);

		do
		{
			AddSegToBBox (bbox, &Segs[i]);
			vert = Segs[i].v2;
			i = Vertices[vert].segs;
			count++;	// to prevent endless loops. Stop when this reaches the number of segs.
		} while (i != DWORD_MAX && (Vertices[vert].x != start.fixX() || Vertices[vert].y != start.fixY()) && count < Segs.Size());

		return true;
	}

	// Try to find a polyobj marked with explicit lines
	bool found = false;

	for (i = 0; i < Segs.Size(); ++i)
	{
		if (Level.Lines[Segs[i].linedef].special == PO_LINE_EXPLICIT &&
			Level.Lines[Segs[i].linedef].args[0] == polynum)
		{
			AddSegToBBox (bbox, &Segs[i]);
			found = true;
		}
	}
	return found;
}